

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trainer.cc
# Opt level: O3

void __thiscall xLearn::Trainer::CVTrain(Trainer *this)

{
  ulong uVar1;
  ostream *poVar2;
  long lVar3;
  ulong uVar4;
  pointer ppRVar5;
  ulong uVar6;
  vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> tr_reader;
  Modifier bold;
  vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> te_reader;
  string local_78;
  Modifier local_50;
  Modifier local_4c;
  void *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar3 = (long)(this->reader_list_).
                super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->reader_list_).
                super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar3 != 0) {
    uVar4 = lVar3 >> 3;
    uVar6 = 0;
    do {
      uVar1 = uVar6 + 1;
      StringPrintf_abi_cxx11_(&local_78,"Cross-validation: %d/%lu:",uVar1 & 0xffffffff,uVar4);
      local_48 = (void *)CONCAT44(local_48._4_4_,0x20);
      local_4c.code = BOLD;
      local_50.code = RESET;
      poVar2 = Color::operator<<((ostream *)&std::cout,(Modifier *)&local_48);
      poVar2 = Color::operator<<(poVar2,&local_4c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"[ ACTION     ] ",0xf);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_78._M_dataplus._M_p,local_78._M_string_length);
      poVar2 = Color::operator<<(poVar2,&local_50);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      local_78.field_2._M_allocated_capacity = 0;
      local_78._M_dataplus._M_p = (pointer)0x0;
      local_78._M_string_length = 0;
      ppRVar5 = (this->reader_list_).
                super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->reader_list_).
          super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppRVar5) {
        lVar3 = 0;
        uVar4 = 0;
        do {
          if (uVar6 != uVar4) {
            if (local_78._M_string_length == local_78.field_2._M_allocated_capacity) {
              std::vector<xLearn::Reader*,std::allocator<xLearn::Reader*>>::
              _M_realloc_insert<xLearn::Reader*const&>
                        ((vector<xLearn::Reader*,std::allocator<xLearn::Reader*>> *)&local_78,
                         (iterator)local_78._M_string_length,(Reader **)((long)ppRVar5 + lVar3));
            }
            else {
              *(Reader **)local_78._M_string_length = *(Reader **)((long)ppRVar5 + lVar3);
              local_78._M_string_length = local_78._M_string_length + 8;
            }
          }
          ppRVar5 = (this->reader_list_).
                    super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar4 = uVar4 + 1;
          lVar3 = lVar3 + 8;
        } while (uVar4 < (ulong)((long)(this->reader_list_).
                                       super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppRVar5 >>
                                3));
      }
      local_38 = 0;
      local_48 = (void *)0x0;
      uStack_40 = 0;
      std::vector<xLearn::Reader*,std::allocator<xLearn::Reader*>>::
      _M_realloc_insert<xLearn::Reader*const&>
                ((vector<xLearn::Reader*,std::allocator<xLearn::Reader*>> *)&local_48,(iterator)0x0,
                 ppRVar5 + uVar6);
      if (uVar6 != 0) {
        Model::set_value(this->model_);
      }
      train(this,(vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)&local_78,
            (vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)&local_48);
      if (local_48 != (void *)0x0) {
        operator_delete(local_48);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      uVar4 = (long)(this->reader_list_).
                    super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->reader_list_).
                    super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
      uVar6 = uVar1;
    } while (uVar1 < uVar4);
  }
  show_average_metric(this);
  return;
}

Assistant:

void Trainer::CVTrain() {
  // Use the i-th reader as validation Reader
  for (int i = 0; i < reader_list_.size(); ++i) {
    Color::print_action(
      StringPrintf("Cross-validation: %d/%lu:", 
        i+1, reader_list_.size())
    );
    // Get the train Reader and test Reader
    std::vector<Reader*> tr_reader;
    for (int j = 0; j < reader_list_.size(); ++j) {
      if (i == j) { continue; }
      tr_reader.push_back(reader_list_[j]);
    }
    std::vector<Reader*> te_reader;
    te_reader.push_back(reader_list_[i]);
    if (i != 0) {
      // Re-init current model parameters.
      model_->Reset();
    }
    this->train(tr_reader, te_reader);
  }
  // Average metric for cross-validation
  show_average_metric();
}